

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::CopyRTShaderGroupNames
               (unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
                *NameToGroupIndex,RayTracingPipelineStateCreateInfo *CreateInfo,
               FixedLinearAllocator *MemPool)

{
  Char *pCVar1;
  char (*in_RCX) [118];
  int iVar2;
  ulong uVar3;
  long lVar4;
  Uint32 i;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false,_false>,_bool>
  pVar5;
  string msg;
  int local_64;
  unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
  *local_60;
  FixedLinearAllocator *local_58;
  string local_50;
  
  lVar4 = 0;
  local_60 = NameToGroupIndex;
  local_58 = MemPool;
  for (uVar3 = 0; iVar2 = (int)uVar3, uVar3 < CreateInfo->GeneralShaderCount; uVar3 = uVar3 + 1) {
    pCVar1 = FixedLinearAllocator::CopyString
                       (local_58,*(char **)((long)&CreateInfo->pGeneralShaders->Name + lVar4),0);
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_50,pCVar1,false);
    local_64 = iVar2;
    pVar5 = std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_60,&local_50,&local_64);
    HashMapStringKey::Clear((HashMapStringKey *)&local_50);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                (&local_50,
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      in_RCX = (char (*) [118])0x32e;
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x32e);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < CreateInfo->TriangleHitShaderCount; uVar3 = uVar3 + 1) {
    pCVar1 = FixedLinearAllocator::CopyString
                       (local_58,*(char **)((long)&CreateInfo->pTriangleHitShaders->Name + lVar4),0)
    ;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_50,pCVar1,false);
    local_64 = (int)uVar3 + iVar2;
    pVar5 = std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_60,&local_50,&local_64);
    HashMapStringKey::Clear((HashMapStringKey *)&local_50);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                (&local_50,
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      in_RCX = (char (*) [118])0x334;
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x334);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar4 = lVar4 + 0x18;
  }
  iVar2 = iVar2 + (int)uVar3;
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < CreateInfo->ProceduralHitShaderCount; uVar3 = uVar3 + 1) {
    pCVar1 = FixedLinearAllocator::CopyString
                       (local_58,*(char **)((long)&CreateInfo->pProceduralHitShaders->Name + lVar4),
                        0);
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_50,pCVar1,false);
    local_64 = iVar2;
    pVar5 = std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_60,&local_50,&local_64);
    HashMapStringKey::Clear((HashMapStringKey *)&local_50);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                (&local_50,
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      in_RCX = (char (*) [118])0x33a;
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x33a);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar4 = lVar4 + 0x20;
    iVar2 = iVar2 + 1;
  }
  if (iVar2 != CreateInfo->ProceduralHitShaderCount + CreateInfo->GeneralShaderCount +
               CreateInfo->TriangleHitShaderCount) {
    FormatString<char[26],char[118]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex"
               ,in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CopyRTShaderGroupNames",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x33d);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void CopyRTShaderGroupNames(std::unordered_map<HashMapStringKey, Uint32>& NameToGroupIndex,
                            const RayTracingPipelineStateCreateInfo&      CreateInfo,
                            FixedLinearAllocator&                         MemPool) noexcept
{
    Uint32 GroupIndex = 0;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pGeneralShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pTriangleHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pProceduralHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }

    VERIFY_EXPR(CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex);
}